

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_io.cpp
# Opt level: O0

shared_ptr<lume::Mesh> __thiscall lume::CreateMeshFromUGX(lume *this,string *filename)

{
  double dVar1;
  __uniq_ptr_impl<lume::GrobArray,_std::default_delete<lume::GrobArray>_> this_00;
  byte bVar2;
  int iVar3;
  FileNotFoundError *this_01;
  char *pcVar4;
  FileParseError *pFVar5;
  __uniq_ptr_data<lume::GrobArray,_std::default_delete<lume::GrobArray>,_true,_true> _Var6;
  element_type *peVar7;
  GrobArray *pGVar8;
  IndexArrayAnnex *pIVar9;
  element_type *peVar10;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Color CVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  shared_ptr<lume::Mesh> sVar14;
  real_t rStack_106b8;
  real_t rStack_106b4;
  shared_ptr<lume::Annex> sStack_10518;
  real_t rStack_10508;
  real_t rStack_10504;
  real_t arStack_10500 [2];
  xml_attribute<char> *pxStack_104f8;
  xml_attribute<char> *attrib_3;
  xml_attribute<char> *attrib_2;
  SubsetProperties props;
  xml_node<char> *pxStack_104a8;
  index_t subsetIndex;
  xml_node<char> *subsetNode;
  undefined1 auStack_10468 [8];
  SPSubsetInfoAnnex subsetInfo;
  xml_attribute<char> *attrib_1;
  string asStack_10448 [8];
  string siName;
  float fStack_10424;
  char *pcStack_10420;
  char *p;
  string asStack_10410 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> abStack_103f0 [38];
  undefined1 uStack_103ca;
  allocator aStack_103c9;
  string asStack_103c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> abStack_103a8 [32];
  xml_attribute<char> *pxStack_10388;
  xml_attribute<char> *attrib;
  char *pcStack_10378;
  int numSrcCoords;
  char *name;
  xml_node<char> *curNode;
  undefined1 auStack_10360 [4];
  int lastNumSrcCoords;
  __uniq_ptr_impl<lume::GrobArray,_std::default_delete<lume::GrobArray>_> _Stack_10350;
  element_type *coords;
  string asStack_10340 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> abStack_10320 [32];
  xml_node<char> *pxStack_10300;
  xml_node<char> *gridNode;
  undefined4 uStack_102f0;
  undefined4 uStack_102ec;
  size_t sStack_102e8;
  streamsize size;
  streampos posEnd;
  streampos posStart;
  long lStack_102b0;
  ifstream in;
  char *fileContent;
  xml_document<char> doc;
  string *filename_local;
  shared_ptr<lume::Mesh> *mesh;
  
  rapidxml::xml_document<char>::xml_document((xml_document<char> *)&fileContent);
  std::ifstream::ifstream(&lStack_102b0,(string *)filename,_S_bin);
  bVar2 = std::ios::operator!((ios *)((long)&lStack_102b0 + *(long *)(lStack_102b0 + -0x18)));
  if ((bVar2 & 1) != 0) {
    this_01 = (FileNotFoundError *)__cxa_allocate_exception(0x70);
    FileNotFoundError::FileNotFoundError(this_01,filename);
    __cxa_throw(this_01,&FileNotFoundError::typeinfo,FileNotFoundError::~FileNotFoundError);
  }
  auVar12 = std::istream::tellg();
  posEnd._M_state = auVar12._0_8_;
  std::istream::seekg((long)&lStack_102b0,_S_beg);
  auVar13 = std::istream::tellg();
  posEnd._M_off = auVar13._8_8_;
  size = auVar13._0_8_;
  sStack_102e8 = std::fpos<__mbstate_t>::operator-
                           ((fpos<__mbstate_t> *)&size,(fpos<__mbstate_t> *)&posEnd._M_state);
  posStart._M_off._0_4_ = auVar12._8_4_;
  posStart._M_off._4_4_ = auVar12._12_4_;
  gridNode._0_4_ = posEnd._M_state.__count;
  gridNode._4_4_ = posEnd._M_state.__value;
  uStack_102f0 = (undefined4)posStart._M_off;
  uStack_102ec = posStart._M_off._4_4_;
  std::istream::seekg(&lStack_102b0,posEnd._M_state,auVar12._8_8_);
  pcVar4 = rapidxml::memory_pool<char>::allocate_string
                     ((memory_pool<char> *)&doc.super_xml_node<char>.m_next_sibling,(char *)0x0,
                      sStack_102e8 + 1);
  std::istream::read((char *)&lStack_102b0,(long)pcVar4);
  pcVar4[sStack_102e8] = '\0';
  std::ifstream::close();
  std::ifstream::~ifstream(&lStack_102b0);
  rapidxml::xml_document<char>::parse<0>((xml_document<char> *)&fileContent,pcVar4);
  pxStack_10300 = rapidxml::xml_node<char>::first_node((xml_node<char> *)&fileContent,"grid",0,true)
  ;
  if (pxStack_10300 == (xml_node<char> *)0x0) {
    coords._6_1_ = 1;
    pFVar5 = (FileParseError *)__cxa_allocate_exception(0x70);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(asStack_10340,"no grid found in ",(allocator *)((long)&coords + 7))
    ;
    std::operator+(abStack_10320,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   asStack_10340);
    FileParseError::FileParseError(pFVar5,abStack_10320);
    coords._6_1_ = 0;
    __cxa_throw(pFVar5,&FileParseError::typeinfo,FileParseError::~FileParseError);
  }
  coords._5_1_ = 0;
  std::make_shared<lume::Mesh>();
  std::__shared_ptr_access<lume::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<lume::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this);
  Mesh::coords((Mesh *)auStack_10360);
  _Var6.super___uniq_ptr_impl<lume::GrobArray,_std::default_delete<lume::GrobArray>_>._M_t.
  super__Tuple_impl<0UL,_lume::GrobArray_*,_std::default_delete<lume::GrobArray>_>.
  super__Head_base<0UL,_lume::GrobArray_*,_false>._M_head_impl =
       (__uniq_ptr_impl<lume::GrobArray,_std::default_delete<lume::GrobArray>_>)
       std::__shared_ptr_access<lume::ArrayAnnex<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
       operator*((__shared_ptr_access<lume::ArrayAnnex<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)auStack_10360);
  std::shared_ptr<lume::ArrayAnnex<float>_>::~shared_ptr
            ((shared_ptr<lume::ArrayAnnex<float>_> *)auStack_10360);
  curNode._4_4_ = 0xffffffff;
  _Stack_10350._M_t.super__Tuple_impl<0UL,_lume::GrobArray_*,_std::default_delete<lume::GrobArray>_>
  .super__Head_base<0UL,_lume::GrobArray_*,_false>._M_head_impl =
       (tuple<lume::GrobArray_*,_std::default_delete<lume::GrobArray>_>)
       (tuple<lume::GrobArray_*,_std::default_delete<lume::GrobArray>_>)
       _Var6.super___uniq_ptr_impl<lume::GrobArray,_std::default_delete<lume::GrobArray>_>._M_t.
       super__Tuple_impl<0UL,_lume::GrobArray_*,_std::default_delete<lume::GrobArray>_>.
       super__Head_base<0UL,_lume::GrobArray_*,_false>._M_head_impl;
  name = (char *)rapidxml::xml_node<char>::first_node(pxStack_10300,(char *)0x0,0,true);
  do {
    if (name == (char *)0x0) {
      coords._5_1_ = 1;
      rapidxml::xml_document<char>::~xml_document((xml_document<char> *)&fileContent);
      sVar14.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           extraout_RDX._M_pi;
      sVar14.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (shared_ptr<lume::Mesh>)
             sVar14.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>;
    }
    pcStack_10378 = rapidxml::xml_base<char>::name((xml_base<char> *)name);
    iVar3 = strcmp(pcStack_10378,"vertices");
    if ((iVar3 == 0) || (iVar3 = strcmp(pcStack_10378,"constrained_vertices"), iVar3 == 0)) {
      attrib._4_4_ = 0xffffffff;
      pxStack_10388 =
           rapidxml::xml_node<char>::first_attribute((xml_node<char> *)name,"coords",0,true);
      if (pxStack_10388 != (xml_attribute<char> *)0x0) {
        pcVar4 = rapidxml::xml_base<char>::value(&pxStack_10388->super_xml_base<char>);
        attrib._4_4_ = atoi(pcVar4);
      }
      if ((int)attrib._4_4_ < 1) {
        uStack_103ca = 1;
        pFVar5 = (FileParseError *)__cxa_allocate_exception(0x70);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (asStack_103c8,"Not enough coordinates provided in ",&aStack_103c9);
        std::operator+(abStack_103a8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       asStack_103c8);
        FileParseError::FileParseError(pFVar5,abStack_103a8);
        uStack_103ca = 0;
        __cxa_throw(pFVar5,&FileParseError::typeinfo,FileParseError::~FileParseError);
      }
      if ((-1 < (int)curNode._4_4_) && (curNode._4_4_ != attrib._4_4_)) {
        p._6_1_ = 1;
        pFVar5 = (FileParseError *)__cxa_allocate_exception(0x70);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (asStack_10410,"Can\'t read vertices with differing numbers of coordinates from ",
                   (allocator *)((long)&p + 7));
        std::operator+(abStack_103f0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       asStack_10410);
        FileParseError::FileParseError(pFVar5,abStack_103f0);
        p._6_1_ = 0;
        __cxa_throw(pFVar5,&FileParseError::typeinfo,FileParseError::~FileParseError);
      }
      curNode._4_4_ = attrib._4_4_;
      ArrayAnnex<float>::set_tuple_size
                ((ArrayAnnex<float> *)
                 _Stack_10350._M_t.
                 super__Tuple_impl<0UL,_lume::GrobArray_*,_std::default_delete<lume::GrobArray>_>.
                 super__Head_base<0UL,_lume::GrobArray_*,_false>._M_head_impl,attrib._4_4_);
      pcVar4 = rapidxml::xml_base<char>::value((xml_base<char> *)name);
      pcStack_10420 = strtok(pcVar4," ");
      while (this_00._M_t.
             super__Tuple_impl<0UL,_lume::GrobArray_*,_std::default_delete<lume::GrobArray>_>.
             super__Head_base<0UL,_lume::GrobArray_*,_false>._M_head_impl =
                  (tuple<lume::GrobArray_*,_std::default_delete<lume::GrobArray>_>)
                  (tuple<lume::GrobArray_*,_std::default_delete<lume::GrobArray>_>)_Stack_10350,
            pcStack_10420 != (char *)0x0) {
        dVar1 = atof(pcStack_10420);
        fStack_10424 = (float)dVar1;
        ArrayAnnex<float>::push_back
                  ((ArrayAnnex<float> *)
                   this_00._M_t.
                   super__Tuple_impl<0UL,_lume::GrobArray_*,_std::default_delete<lume::GrobArray>_>.
                   super__Head_base<0UL,_lume::GrobArray_*,_false>._M_head_impl,&fStack_10424);
        pcStack_10420 = strtok((char *)0x0," ");
      }
    }
    else {
      iVar3 = strcmp(pcStack_10378,"edges");
      if (((iVar3 == 0) || (iVar3 = strcmp(pcStack_10378,"constraining_edges"), iVar3 == 0)) ||
         (iVar3 = strcmp(pcStack_10378,"constrained_edges"), iVar3 == 0)) {
        peVar7 = std::__shared_ptr_access<lume::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<lume::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
        pGVar8 = Mesh::grobs(peVar7,EDGE);
        pIVar9 = GrobArray::underlying_array(pGVar8);
        ReadIndicesToArrayAnnex(pIVar9,(xml_node<char> *)name);
      }
      else {
        iVar3 = strcmp(pcStack_10378,"triangles");
        if (((iVar3 == 0) || (iVar3 = strcmp(pcStack_10378,"constraining_triangles"), iVar3 == 0))
           || (iVar3 = strcmp(pcStack_10378,"constrained_triangles"), iVar3 == 0)) {
          peVar7 = std::__shared_ptr_access<lume::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<lume::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
          pGVar8 = Mesh::grobs(peVar7,TRI);
          pIVar9 = GrobArray::underlying_array(pGVar8);
          ReadIndicesToArrayAnnex(pIVar9,(xml_node<char> *)name);
        }
        else {
          iVar3 = strcmp(pcStack_10378,"quadrilaterals");
          if (((iVar3 == 0) ||
              (iVar3 = strcmp(pcStack_10378,"constraining_quadrilaterals"), iVar3 == 0)) ||
             (iVar3 = strcmp(pcStack_10378,"constrained_quadrilaterals"), iVar3 == 0)) {
            peVar7 = std::__shared_ptr_access<lume::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<lume::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)this);
            pGVar8 = Mesh::grobs(peVar7,QUAD);
            pIVar9 = GrobArray::underlying_array(pGVar8);
            ReadIndicesToArrayAnnex(pIVar9,(xml_node<char> *)name);
          }
          else {
            iVar3 = strcmp(pcStack_10378,"tetrahedrons");
            if (iVar3 == 0) {
              peVar7 = std::
                       __shared_ptr_access<lume::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                       operator->((__shared_ptr_access<lume::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)this);
              pGVar8 = Mesh::grobs(peVar7,TET);
              pIVar9 = GrobArray::underlying_array(pGVar8);
              ReadIndicesToArrayAnnex(pIVar9,(xml_node<char> *)name);
            }
            else {
              iVar3 = strcmp(pcStack_10378,"hexahedrons");
              if (iVar3 == 0) {
                peVar7 = std::
                         __shared_ptr_access<lume::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                         operator->((__shared_ptr_access<lume::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)this);
                pGVar8 = Mesh::grobs(peVar7,HEX);
                pIVar9 = GrobArray::underlying_array(pGVar8);
                ReadIndicesToArrayAnnex(pIVar9,(xml_node<char> *)name);
              }
              else {
                iVar3 = strcmp(pcStack_10378,"pyramids");
                if (iVar3 == 0) {
                  peVar7 = std::
                           __shared_ptr_access<lume::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<lume::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)this);
                  pGVar8 = Mesh::grobs(peVar7,PYRA);
                  pIVar9 = GrobArray::underlying_array(pGVar8);
                  ReadIndicesToArrayAnnex(pIVar9,(xml_node<char> *)name);
                }
                else {
                  iVar3 = strcmp(pcStack_10378,"prisms");
                  if (iVar3 == 0) {
                    peVar7 = std::
                             __shared_ptr_access<lume::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             ::operator->((__shared_ptr_access<lume::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           *)this);
                    pGVar8 = Mesh::grobs(peVar7,PRISM);
                    pIVar9 = GrobArray::underlying_array(pGVar8);
                    ReadIndicesToArrayAnnex(pIVar9,(xml_node<char> *)name);
                  }
                  else {
                    iVar3 = strcmp(pcStack_10378,"subset_handler");
                    if (iVar3 == 0) {
                      peVar7 = std::
                               __shared_ptr_access<lume::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               ::operator*((__shared_ptr_access<lume::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                            *)this);
                      impl::GenerateVertexIndicesFromCoords(peVar7);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string
                                (asStack_10448,"subsetHandler",(allocator *)((long)&attrib_1 + 7));
                      std::allocator<char>::~allocator((allocator<char> *)((long)&attrib_1 + 7));
                      subsetInfo.
                      super___shared_ptr<lume::SubsetInfoAnnex,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi =
                           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           rapidxml::xml_node<char>::first_attribute
                                     ((xml_node<char> *)name,"name",0,true);
                      if ((xml_attribute<char> *)
                          subsetInfo.
                          super___shared_ptr<lume::SubsetInfoAnnex,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi != (xml_attribute<char> *)0x0) {
                        pcVar4 = rapidxml::xml_base<char>::value
                                           ((xml_base<char> *)
                                            subsetInfo.
                                            super___shared_ptr<lume::SubsetInfoAnnex,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount._M_pi);
                        std::__cxx11::string::operator=(asStack_10448,pcVar4);
                      }
                      std::make_shared<lume::SubsetInfoAnnex,std::__cxx11::string&>
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)auStack_10468);
                      peVar10 = std::
                                __shared_ptr_access<lume::SubsetInfoAnnex,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                ::operator->((__shared_ptr_access<lume::SubsetInfoAnnex,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                              *)auStack_10468);
                      SubsetInfoAnnex::SubsetProperties::SubsetProperties
                                ((SubsetProperties *)&subsetNode);
                      SubsetInfoAnnex::add_subset(peVar10,(SubsetProperties *)&subsetNode);
                      SubsetInfoAnnex::SubsetProperties::~SubsetProperties
                                ((SubsetProperties *)&subsetNode);
                      pxStack_104a8 =
                           rapidxml::xml_node<char>::first_node
                                     ((xml_node<char> *)name,"subset",0,true);
                      props._52_4_ = 1;
                      for (; pxStack_104a8 != (xml_node<char> *)0x0;
                          pxStack_104a8 =
                               rapidxml::xml_node<char>::next_sibling
                                         (pxStack_104a8,(char *)0x0,0,true)) {
                        SubsetInfoAnnex::SubsetProperties::SubsetProperties
                                  ((SubsetProperties *)&attrib_2);
                        attrib_3 = rapidxml::xml_node<char>::first_attribute
                                             (pxStack_104a8,"name",0,true);
                        if (attrib_3 != (xml_attribute<char> *)0x0) {
                          pcVar4 = rapidxml::xml_base<char>::value(&attrib_3->super_xml_base<char>);
                          std::__cxx11::string::operator=((string *)&attrib_2,pcVar4);
                        }
                        pxStack_104f8 =
                             rapidxml::xml_node<char>::first_attribute(pxStack_104a8,"color",0,true)
                        ;
                        if (pxStack_104f8 != (xml_attribute<char> *)0x0) {
                          pcVar4 = rapidxml::xml_base<char>::value
                                             (&pxStack_104f8->super_xml_base<char>);
                          CVar11 = ParseColor(pcVar4);
                          arStack_10500 = CVar11.m_data._8_8_;
                          props._24_8_ = CVar11.m_data._0_8_;
                          rStack_106b8 = CVar11.m_data[0];
                          rStack_106b4 = CVar11.m_data[1];
                          rStack_10508 = rStack_106b8;
                          rStack_10504 = rStack_106b4;
                          props.color.m_data._0_8_ = arStack_10500;
                        }
                        ParseElementIndicesToArrayAnnex<unsigned_int>
                                  ((SPMesh *)this,(string *)asStack_10448,pxStack_104a8,props._52_4_
                                  );
                        peVar10 = std::
                                  __shared_ptr_access<lume::SubsetInfoAnnex,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  ::operator->((__shared_ptr_access<lume::SubsetInfoAnnex,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                *)auStack_10468);
                        SubsetInfoAnnex::add_subset(peVar10,(SubsetProperties *)&attrib_2);
                        props._52_4_ = props._52_4_ + 1;
                        SubsetInfoAnnex::SubsetProperties::~SubsetProperties
                                  ((SubsetProperties *)&attrib_2);
                      }
                      peVar7 = std::
                               __shared_ptr_access<lume::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               ::operator->((__shared_ptr_access<lume::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                             *)this);
                      std::shared_ptr<lume::Annex>::shared_ptr<lume::SubsetInfoAnnex,void>
                                (&sStack_10518,(shared_ptr<lume::SubsetInfoAnnex> *)auStack_10468);
                      Mesh::set_annex(peVar7,(string *)asStack_10448,NO_GROB,&sStack_10518);
                      std::shared_ptr<lume::Annex>::~shared_ptr(&sStack_10518);
                      std::shared_ptr<lume::SubsetInfoAnnex>::~shared_ptr
                                ((shared_ptr<lume::SubsetInfoAnnex> *)auStack_10468);
                      std::__cxx11::string::~string(asStack_10448);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    name = (char *)rapidxml::xml_node<char>::next_sibling((xml_node<char> *)name,(char *)0x0,0,true)
    ;
  } while( true );
}

Assistant:

std::shared_ptr <Mesh> CreateMeshFromUGX (std::string filename)
{
	xml_document<> doc;
	char* fileContent = nullptr;

	{
		ifstream in(filename, ios::binary);
		if (!in)
			throw FileNotFoundError (filename);

	//	get the length of the file
		streampos posStart = in.tellg();
		in.seekg(0, ios_base::end);
		streampos posEnd = in.tellg();
		streamsize size = posEnd - posStart;

	//	go back to the start of the file
		in.seekg(posStart);

	//	read the whole file en-block and terminate it with 0
		fileContent = doc.allocate_string(0, size + 1);
		in.read(fileContent, size);
		fileContent[size] = 0;
		in.close();
	}

	doc.parse<0>(fileContent);

	xml_node<>* gridNode = doc.first_node("grid");
	if (!gridNode)
		throw FileParseError (string ("no grid found in ") + filename);

	auto mesh = make_shared <Mesh> ();
	auto& coords = *mesh->coords();

	int lastNumSrcCoords = -1;
	xml_node<>* curNode = gridNode->first_node();
	for(;curNode; curNode = curNode->next_sibling()) {
		const char* name = curNode->name();

		if(strcmp(name, "vertices") == 0 || strcmp(name, "constrained_vertices") == 0)
		{
			int numSrcCoords = -1;
			xml_attribute<>* attrib = curNode->first_attribute("coords");
			if(attrib)
				numSrcCoords = atoi(attrib->value());

			if (numSrcCoords < 1)
				throw FileParseError (string ("Not enough coordinates provided in ") + filename);

			if (lastNumSrcCoords >= 0 && lastNumSrcCoords != numSrcCoords)
				throw FileParseError (string ("Can't read vertices with differing numbers "
			            "of coordinates from ") + filename);

			lastNumSrcCoords = numSrcCoords;
			coords.set_tuple_size (numSrcCoords);
			
		//	create a buffer with which we can access the data
			char* p = strtok (curNode->value(), " ");
			while (p) {
			//	read the data
				coords.push_back (real_t (atof(p)));
				p = strtok (nullptr, " ");
			}
		}

		else if(strcmp(name, "edges") == 0
		        || strcmp(name, "constraining_edges") == 0
		        || strcmp(name, "constrained_edges") == 0)
		{
			ReadIndicesToArrayAnnex (mesh->grobs (EDGE).underlying_array (), curNode);
		}

		else if(strcmp(name, "triangles") == 0
		        || strcmp(name, "constraining_triangles") == 0
		        || strcmp(name, "constrained_triangles") == 0)
		{
			ReadIndicesToArrayAnnex (mesh->grobs (TRI).underlying_array (), curNode);
		}

		else if(strcmp(name, "quadrilaterals") == 0
		        || strcmp(name, "constraining_quadrilaterals") == 0
		        || strcmp(name, "constrained_quadrilaterals") == 0)
		{
			ReadIndicesToArrayAnnex (mesh->grobs (QUAD).underlying_array (), curNode);
		}

		else if(strcmp(name, "tetrahedrons") == 0)
			ReadIndicesToArrayAnnex (mesh->grobs (TET).underlying_array (), curNode);

		else if(strcmp(name, "hexahedrons") == 0)
			ReadIndicesToArrayAnnex (mesh->grobs (HEX).underlying_array (), curNode);

		else if(strcmp(name, "pyramids") == 0)
			ReadIndicesToArrayAnnex (mesh->grobs (PYRA).underlying_array (), curNode);

		else if(strcmp(name, "prisms") == 0)
			ReadIndicesToArrayAnnex (mesh->grobs (PRISM).underlying_array (), curNode);

		// else if(strcmp(name, "octahedrons") == 0)
		// 	bSuccess = create_octahedrons(volumes, grid, curNode, vertices);

		else if(strcmp(name, "subset_handler") == 0) {
		//	make sure that vertex indices are present
			impl::GenerateVertexIndicesFromCoords (*mesh);

			string siName = "subsetHandler";
			if (xml_attribute<>* attrib = curNode->first_attribute("name"))
				siName = attrib->value();

			SPSubsetInfoAnnex subsetInfo = make_shared <SubsetInfoAnnex> (siName);
			subsetInfo->add_subset (SubsetInfoAnnex::SubsetProperties ());

			xml_node<>* subsetNode = curNode->first_node("subset");
			index_t subsetIndex = 1;
			for(;subsetNode; subsetNode = subsetNode->next_sibling()) {
				SubsetInfoAnnex::SubsetProperties props;
				if (xml_attribute<>* attrib = subsetNode->first_attribute("name"))
					props.name = attrib->value();
				if (xml_attribute<>* attrib = subsetNode->first_attribute("color"))
					props.color = ParseColor (attrib->value());

				ParseElementIndicesToArrayAnnex (mesh, siName, subsetNode, subsetIndex);

				subsetInfo->add_subset (std::move (props));
				++subsetIndex;
			}

			mesh->set_annex (siName, NO_GROB, subsetInfo);
		}

		// else if(strcmp(name, "vertex_attachment") == 0)
		// 	bSuccess = read_attachment<Vertex>(grid, curNode);
		// else if(strcmp(name, "edge_attachment") == 0)
		// 	bSuccess = read_attachment<Edge>(grid, curNode);
		// else if(strcmp(name, "face_attachment") == 0)
		// 	bSuccess = read_attachment<Face>(grid, curNode);
		// else if(strcmp(name, "volume_attachment") == 0)
		// 	bSuccess = read_attachment<Volume>(grid, curNode);
	}

	return mesh;
}